

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2latlng_rect_bounder.cc
# Opt level: O3

void __thiscall S2LatLngRectBounder::AddPoint(S2LatLngRectBounder *this,S2Point *b)

{
  bool bVar1;
  S2LogMessage SStack_28;
  
  bVar1 = S2::IsUnitLength(b);
  if (bVar1) {
    S2LatLng::S2LatLng((S2LatLng *)&SStack_28,b);
    AddInternal(this,b,(S2LatLng *)&SStack_28);
    return;
  }
  S2LogMessage::S2LogMessage
            (&SStack_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2latlng_rect_bounder.cc"
             ,0x22,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (SStack_28.stream_,"Check failed: S2::IsUnitLength(b) ",0x22);
  abort();
}

Assistant:

void S2LatLngRectBounder::AddPoint(const S2Point& b) {
  S2_DCHECK(S2::IsUnitLength(b));
  AddInternal(b, S2LatLng(b));
}